

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

string * __thiscall
wabt::(anonymous_namespace)::CWriter::ExportName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view export_name)

{
  char *pcVar1;
  string_view name;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = export_name._M_str;
  std::operator+(&local_70,"w2c_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x1f8)
                );
  std::operator+(&local_50,&local_70,'_');
  name._M_str = pcVar1;
  name._M_len = (size_t)export_name._M_str;
  MangleName_abi_cxx11_(&local_90,(CWriter *)export_name._M_len,name);
  std::operator+(__return_storage_ptr__,&local_50,&local_90);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::ExportName(std::string_view export_name) {
  return kSymbolPrefix + module_prefix_ + '_' + MangleName(export_name);
}